

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zesDeviceEnumTemperatureSensors
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_temp_handle_t *phTemperature)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesDeviceEnumTemperatureSensors(hDevice, pCount, phTemperature)",""
            );
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0x950);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar7 = lVar2 - lVar6 >> 3;
    if (lVar2 != lVar6) {
      lVar5 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x7c0))(plVar3,hDevice,pCount,phTemperature);
        if (result != ZE_RESULT_SUCCESS) goto LAB_001834e8;
        lVar5 = lVar5 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar5);
    }
    lVar5 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZESHandleLifetimeValidation::zesDeviceEnumTemperatureSensorsPrologue
                            ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hDevice
                             ,pCount,phTemperature), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hDevice,pCount,phTemperature), result = zVar4, lVar2 != lVar6)) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar5 + 0xd30) + lVar6 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x7c8))(plVar3,hDevice,pCount,phTemperature,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar6 = lVar6 + 1;
        result = zVar4;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
    }
  }
LAB_001834e8:
  logAndPropagateResult("zesDeviceEnumTemperatureSensors",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumTemperatureSensors(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_temp_handle_t* phTemperature                ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        context.logger->log_trace("zesDeviceEnumTemperatureSensors(hDevice, pCount, phTemperature)");

        auto pfnEnumTemperatureSensors = context.zesDdiTable.Device.pfnEnumTemperatureSensors;

        if( nullptr == pfnEnumTemperatureSensors )
            return logAndPropagateResult("zesDeviceEnumTemperatureSensors", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceEnumTemperatureSensorsPrologue( hDevice, pCount, phTemperature );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceEnumTemperatureSensors", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDeviceEnumTemperatureSensorsPrologue( hDevice, pCount, phTemperature );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceEnumTemperatureSensors", result);
        }

        auto driver_result = pfnEnumTemperatureSensors( hDevice, pCount, phTemperature );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceEnumTemperatureSensorsEpilogue( hDevice, pCount, phTemperature ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceEnumTemperatureSensors", result);
        }

        return logAndPropagateResult("zesDeviceEnumTemperatureSensors", driver_result);
    }